

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

void __thiscall
QRhiGles2::endPass(QRhiGles2 *this,QRhiCommandBuffer *cb,QRhiResourceUpdateBatch *resourceUpdates)

{
  QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *this_00;
  int iVar1;
  int iVar2;
  _func_int **pp_Var3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  Command *pCVar9;
  int iVar10;
  GLuint GVar11;
  uint uVar12;
  float fVar13;
  qint32 qVar14;
  uint uVar15;
  _func_int *p_Var16;
  QGles2Texture *depthResolveTexD;
  _func_int *p_Var17;
  int resolveIdx;
  int iVar18;
  uint uVar19;
  QGles2RenderBuffer *rbD;
  quint32 qVar20;
  long in_FS_OFFSET;
  quint32 local_a0;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = (**(code **)(*cb[5].super_QRhiResource._vptr_QRhiResource + 0x10))();
  if (iVar8 == 6) {
    pp_Var3 = cb[5].super_QRhiResource._vptr_QRhiResource;
    p_Var17 = pp_Var3[9];
    p_Var16 = p_Var17 + (long)pp_Var3[8] * 0x30;
    this_00 = (QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)(cb + 1);
    for (; p_Var17 != p_Var16; p_Var17 = p_Var17 + 0x30) {
      lVar4 = *(long *)(p_Var17 + 0x18);
      if (lVar4 != 0) {
        uVar5 = *(ulong *)(lVar4 + 0x34);
        lVar6 = *(long *)(p_Var17 + 8);
        iVar8 = (int)uVar5;
        local_a0 = (quint32)(uVar5 >> 0x20);
        if (lVar6 == 0) {
          if (((this->caps).field_0x3d & 1) == 0) {
            lVar6 = *(long *)p_Var17;
            uVar7 = *(ulong *)(lVar6 + 0x34);
            if (((int)uVar7 != iVar8) || ((quint32)(uVar7 >> 0x20) != local_a0)) {
              local_58[0] = '\x02';
              local_58[1] = '\0';
              local_58[2] = '\0';
              local_58[3] = '\0';
              local_58[4] = '\0';
              local_58[5] = '\0';
              local_58[6] = '\0';
              local_58[7] = '\0';
              local_58[8] = '\0';
              local_58[9] = '\0';
              local_58[10] = '\0';
              local_58[0xb] = '\0';
              local_58[0xc] = '\0';
              local_58[0xd] = '\0';
              local_58[0xe] = '\0';
              local_58[0xf] = '\0';
              local_58[0x10] = '\0';
              local_58[0x11] = '\0';
              local_58[0x12] = '\0';
              local_58[0x13] = '\0';
              local_58[0x14] = '\0';
              local_58[0x15] = '\0';
              local_58[0x16] = '\0';
              local_58[0x17] = '\0';
              local_40 = "default";
              QMessageLogger::warning
                        (local_58,"Resolve source (%dx%d) and target (%dx%d) size does not match",
                         uVar7,uVar7 >> 0x20,uVar5,uVar5 >> 0x20);
            }
            iVar10 = *(int *)(p_Var17 + 0x28);
            if (iVar10 < 2) {
              iVar10 = 1;
            }
            for (iVar18 = 0; iVar10 != iVar18; iVar18 = iVar18 + 1) {
              iVar1 = *(int *)(p_Var17 + 0x10);
              iVar2 = *(int *)(p_Var17 + 0x20);
              pCVar9 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get(this_00);
              pCVar9->cmd = BlitFromTexture;
              if ((*(byte *)(lVar6 + 0x48) & 4) == 0) {
                GVar11 = *(GLuint *)(lVar6 + 0x6c);
              }
              else {
                GVar11 = iVar1 + iVar18 + 0x8515;
              }
              (pCVar9->args).beginFrame.timestampQuery = GVar11;
              (pCVar9->args).viewport.y = *(float *)(lVar6 + 100);
              (pCVar9->args).viewport.w = *(float *)(p_Var17 + 0x14);
              (pCVar9->args).viewport.h = 0.0;
              uVar12 = *(uint *)(lVar6 + 0x48) & 0x1400;
              if (uVar12 != 0) {
                uVar12 = iVar1 + iVar18;
              }
              (pCVar9->args).bindVertexBuffer.offset = uVar12;
              (pCVar9->args).bindVertexBuffer.binding = iVar8;
              (pCVar9->args).draw.baseInstance = local_a0;
              if ((*(byte *)(lVar4 + 0x48) & 4) == 0) {
                qVar14 = *(qint32 *)(lVar4 + 0x6c);
              }
              else {
                qVar14 = iVar18 + 0x8515 + iVar2;
              }
              (pCVar9->args).drawIndexed.baseVertex = qVar14;
              (pCVar9->args).bindShaderResources.dynamicOffsetPairs[0] = *(uint *)(lVar4 + 100);
              (pCVar9->args).bindShaderResources.dynamicOffsetPairs[1] = *(uint *)(p_Var17 + 0x24);
              (pCVar9->args).bindShaderResources.dynamicOffsetPairs[2] = 0;
              uVar12 = *(uint *)(lVar4 + 0x48) & 0x1400;
              if (uVar12 != 0) {
                uVar12 = iVar2 + iVar18;
              }
              (pCVar9->args).bindShaderResources.dynamicOffsetPairs[2] = uVar12;
              (pCVar9->args).blitFromTexture.isDepthStencil = false;
            }
          }
        }
        else {
          uVar7 = *(ulong *)(lVar6 + 0x34);
          if (((int)uVar7 != iVar8) || ((quint32)(uVar7 >> 0x20) != local_a0)) {
            local_58[0] = '\x02';
            local_58[1] = '\0';
            local_58[2] = '\0';
            local_58[3] = '\0';
            local_58[4] = '\0';
            local_58[5] = '\0';
            local_58[6] = '\0';
            local_58[7] = '\0';
            local_58[8] = '\0';
            local_58[9] = '\0';
            local_58[10] = '\0';
            local_58[0xb] = '\0';
            local_58[0xc] = '\0';
            local_58[0xd] = '\0';
            local_58[0xe] = '\0';
            local_58[0xf] = '\0';
            local_58[0x10] = '\0';
            local_58[0x11] = '\0';
            local_58[0x12] = '\0';
            local_58[0x13] = '\0';
            local_58[0x14] = '\0';
            local_58[0x15] = '\0';
            local_58[0x16] = '\0';
            local_58[0x17] = '\0';
            local_40 = "default";
            QMessageLogger::warning
                      (local_58,"Resolve source (%dx%d) and target (%dx%d) size does not match",
                       uVar7,uVar7 >> 0x20,uVar5,uVar5 >> 0x20);
          }
          if (((this->caps).field_0x3d & 1) == 0) {
            pCVar9 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get(this_00);
            pCVar9->cmd = BlitFromRenderbuffer;
            (pCVar9->args).beginFrame.timestampQuery = *(GLuint *)(lVar6 + 0x48);
            (pCVar9->args).scissor.y = iVar8;
            (pCVar9->args).scissor.w = local_a0;
            if ((*(byte *)(lVar4 + 0x48) & 4) == 0) {
              fVar13 = *(float *)(lVar4 + 0x6c);
            }
            else {
              fVar13 = (float)(*(int *)(p_Var17 + 0x20) + 0x8515);
            }
            (pCVar9->args).viewport.h = fVar13;
            (pCVar9->args).viewport.d0 = *(float *)(lVar4 + 100);
            (pCVar9->args).viewport.d1 = *(float *)(p_Var17 + 0x24);
            if ((*(byte *)(lVar4 + 0x49) & 0x14) == 0) {
              qVar14 = 0;
            }
            else {
              qVar14 = *(qint32 *)(p_Var17 + 0x20);
            }
            (pCVar9->args).drawIndexed.baseVertex = qVar14;
            (pCVar9->args).blitFromRenderbuffer.isDepthStencil = false;
          }
        }
      }
    }
    p_Var17 = pp_Var3[0x3c];
    if (p_Var17 != (_func_int *)0x0) {
      p_Var16 = pp_Var3[0x3a];
      iVar8 = (int)*(undefined8 *)(p_Var17 + 0x34);
      qVar20 = (quint32)((ulong)*(undefined8 *)(p_Var17 + 0x34) >> 0x20);
      if (p_Var16 == (_func_int *)0x0) {
        if (((this->caps).field_0x3d & 1) == 0) {
          p_Var16 = pp_Var3[0x3b];
          uVar15 = 1;
          if (1 < (int)*(uint *)(p_Var16 + 0x40)) {
            uVar15 = *(uint *)(p_Var16 + 0x40);
          }
          for (uVar19 = 0; uVar15 != uVar19; uVar19 = uVar19 + 1) {
            pCVar9 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get(this_00);
            pCVar9->cmd = BlitFromTexture;
            (pCVar9->args).beginFrame.timestampQuery = *(GLuint *)(p_Var16 + 0x6c);
            (pCVar9->args).viewport.y = *(float *)(p_Var16 + 100);
            (pCVar9->args).viewport.w = 0.0;
            (pCVar9->args).scissor.h = uVar19;
            (pCVar9->args).bindVertexBuffer.binding = iVar8;
            (pCVar9->args).draw.baseInstance = qVar20;
            (pCVar9->args).drawIndexed.baseVertex = *(qint32 *)(p_Var17 + 0x6c);
            (pCVar9->args).bindShaderResources.dynamicOffsetPairs[0] = *(uint *)(p_Var17 + 100);
            (pCVar9->args).bindShaderResources.dynamicOffsetPairs[1] = 0;
            (pCVar9->args).bindShaderResources.dynamicOffsetPairs[2] = uVar19;
            (pCVar9->args).blitFromTexture.isDepthStencil = true;
          }
        }
      }
      else {
        pCVar9 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get(this_00);
        pCVar9->cmd = BlitFromRenderbuffer;
        (pCVar9->args).beginFrame.timestampQuery = *(GLuint *)(p_Var16 + 0x48);
        (pCVar9->args).scissor.y = iVar8;
        (pCVar9->args).scissor.w = qVar20;
        (pCVar9->args).viewport.h = *(float *)(p_Var17 + 0x6c);
        (pCVar9->args).viewport.d0 = *(float *)(p_Var17 + 100);
        *(undefined8 *)((long)&(pCVar9->args).bindShaderResources.srb + 4) = 0;
        (pCVar9->args).blitFromRenderbuffer.isDepthStencil = true;
      }
    }
    if (((pp_Var3[0x3a] != (_func_int *)0x0) ||
        ((pp_Var3[0x3b] != (_func_int *)0x0 && (((ulong)pp_Var3[0x3e] & 4) != 0)))) &&
       (pp_Var3[0x3c] == (_func_int *)0x0)) {
      pCVar9 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get(this_00);
      pCVar9->cmd = InvalidateFramebuffer;
      if (((this->caps).field_0x39 & 0x40) == 0) {
        (pCVar9->args).bindVertexBuffer.ps = (QRhiGraphicsPipeline *)0x8d0000000002;
        (pCVar9->args).viewport.w = 5.06261e-41;
      }
      else {
        (pCVar9->args).bindVertexBuffer.ps = (QRhiGraphicsPipeline *)0x821a00000001;
      }
    }
  }
  *(undefined4 *)((long)&cb[4].super_QRhiResource.m_objectName.d.d + 4) = 0;
  cb[5].super_QRhiResource._vptr_QRhiResource = (_func_int **)0x0;
  if (resourceUpdates != (QRhiResourceUpdateBatch *)0x0) {
    enqueueResourceUpdates(this,cb,resourceUpdates);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::endPass(QRhiCommandBuffer *cb, QRhiResourceUpdateBatch *resourceUpdates)
{
    QGles2CommandBuffer *cbD = QRHI_RES(QGles2CommandBuffer, cb);
    Q_ASSERT(cbD->recordingPass == QGles2CommandBuffer::RenderPass);

    if (cbD->currentTarget->resourceType() == QRhiResource::TextureRenderTarget) {
        QGles2TextureRenderTarget *rtTex = QRHI_RES(QGles2TextureRenderTarget, cbD->currentTarget);
        for (auto it = rtTex->m_desc.cbeginColorAttachments(), itEnd = rtTex->m_desc.cendColorAttachments();
             it != itEnd; ++it)
        {
            const QRhiColorAttachment &colorAtt(*it);
            if (!colorAtt.resolveTexture())
                continue;

            QGles2Texture *resolveTexD = QRHI_RES(QGles2Texture, colorAtt.resolveTexture());
            const QSize size = resolveTexD->pixelSize();
            if (colorAtt.renderBuffer()) {
                QGles2RenderBuffer *rbD = QRHI_RES(QGles2RenderBuffer, colorAtt.renderBuffer());
                if (rbD->pixelSize() != size) {
                    qWarning("Resolve source (%dx%d) and target (%dx%d) size does not match",
                             rbD->pixelSize().width(), rbD->pixelSize().height(), size.width(), size.height());
                }
                if (caps.glesMultisampleRenderToTexture) {
                    // colorAtt.renderBuffer() is not actually used for anything if OpenGL ES'
                    // auto-resolving GL_EXT_multisampled_render_to_texture is used.
                } else {
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromRenderbuffer;
                    cmd.args.blitFromRenderbuffer.renderbuffer = rbD->renderbuffer;
                    cmd.args.blitFromRenderbuffer.w = size.width();
                    cmd.args.blitFromRenderbuffer.h = size.height();
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromRenderbuffer.target = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(colorAtt.resolveLayer());
                    else
                        cmd.args.blitFromRenderbuffer.target = resolveTexD->target;
                    cmd.args.blitFromRenderbuffer.dstTexture = resolveTexD->texture;
                    cmd.args.blitFromRenderbuffer.dstLevel = colorAtt.resolveLevel();
                    const bool hasZ = resolveTexD->m_flags.testFlag(QRhiTexture::ThreeDimensional)
                        || resolveTexD->m_flags.testFlag(QRhiTexture::TextureArray);
                    cmd.args.blitFromRenderbuffer.dstLayer = hasZ ? colorAtt.resolveLayer() : 0;
                    cmd.args.blitFromRenderbuffer.isDepthStencil = false;
                }
            } else if (caps.glesMultisampleRenderToTexture) {
                // Nothing to do, resolving into colorAtt.resolveTexture() is automatic,
                // colorAtt.texture() is in fact not used for anything.
            } else {
                Q_ASSERT(colorAtt.texture());
                QGles2Texture *texD = QRHI_RES(QGles2Texture, colorAtt.texture());
                if (texD->pixelSize() != size) {
                    qWarning("Resolve source (%dx%d) and target (%dx%d) size does not match",
                             texD->pixelSize().width(), texD->pixelSize().height(), size.width(), size.height());
                }
                const int resolveCount = colorAtt.multiViewCount() >= 2 ? colorAtt.multiViewCount() : 1;
                for (int resolveIdx = 0; resolveIdx < resolveCount; ++resolveIdx) {
                    const int srcLayer = colorAtt.layer() + resolveIdx;
                    const int dstLayer = colorAtt.resolveLayer() + resolveIdx;
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromTexture;
                    if (texD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromTexture.srcTarget = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(srcLayer);
                    else
                        cmd.args.blitFromTexture.srcTarget = texD->target;
                    cmd.args.blitFromTexture.srcTexture = texD->texture;
                    cmd.args.blitFromTexture.srcLevel = colorAtt.level();
                    cmd.args.blitFromTexture.srcLayer = 0;
                    if (texD->m_flags.testFlag(QRhiTexture::ThreeDimensional) || texD->m_flags.testFlag(QRhiTexture::TextureArray))
                        cmd.args.blitFromTexture.srcLayer = srcLayer;
                    cmd.args.blitFromTexture.w = size.width();
                    cmd.args.blitFromTexture.h = size.height();
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromTexture.dstTarget = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(dstLayer);
                    else
                        cmd.args.blitFromTexture.dstTarget = resolveTexD->target;
                    cmd.args.blitFromTexture.dstTexture = resolveTexD->texture;
                    cmd.args.blitFromTexture.dstLevel = colorAtt.resolveLevel();
                    cmd.args.blitFromTexture.dstLayer = 0;
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::ThreeDimensional) || resolveTexD->m_flags.testFlag(QRhiTexture::TextureArray))
                        cmd.args.blitFromTexture.dstLayer = dstLayer;
                    cmd.args.blitFromTexture.isDepthStencil = false;
                }
            }
        }

        if (rtTex->m_desc.depthResolveTexture()) {
            QGles2Texture *depthResolveTexD = QRHI_RES(QGles2Texture, rtTex->m_desc.depthResolveTexture());
            const QSize size = depthResolveTexD->pixelSize();
            if (rtTex->m_desc.depthStencilBuffer()) {
                QGles2RenderBuffer *rbD = QRHI_RES(QGles2RenderBuffer, rtTex->m_desc.depthStencilBuffer());
                QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                cmd.cmd = QGles2CommandBuffer::Command::BlitFromRenderbuffer;
                cmd.args.blitFromRenderbuffer.renderbuffer = rbD->renderbuffer;
                cmd.args.blitFromRenderbuffer.w = size.width();
                cmd.args.blitFromRenderbuffer.h = size.height();
                cmd.args.blitFromRenderbuffer.target = depthResolveTexD->target;
                cmd.args.blitFromRenderbuffer.dstTexture = depthResolveTexD->texture;
                cmd.args.blitFromRenderbuffer.dstLevel = 0;
                cmd.args.blitFromRenderbuffer.dstLayer = 0;
                cmd.args.blitFromRenderbuffer.isDepthStencil = true;
            } else if (caps.glesMultisampleRenderToTexture) {
                // Nothing to do, resolving into depthResolveTexture() is automatic.
            } else {
                QGles2Texture *depthTexD = QRHI_RES(QGles2Texture, rtTex->m_desc.depthTexture());
                const int resolveCount = depthTexD->arraySize() >= 2 ? depthTexD->arraySize() : 1;
                for (int resolveIdx = 0; resolveIdx < resolveCount; ++resolveIdx) {
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromTexture;
                    cmd.args.blitFromTexture.srcTarget = depthTexD->target;
                    cmd.args.blitFromTexture.srcTexture = depthTexD->texture;
                    cmd.args.blitFromTexture.srcLevel = 0;
                    cmd.args.blitFromTexture.srcLayer = resolveIdx;
                    cmd.args.blitFromTexture.w = size.width();
                    cmd.args.blitFromTexture.h = size.height();
                    cmd.args.blitFromTexture.dstTarget = depthResolveTexD->target;
                    cmd.args.blitFromTexture.dstTexture = depthResolveTexD->texture;
                    cmd.args.blitFromTexture.dstLevel = 0;
                    cmd.args.blitFromTexture.dstLayer = resolveIdx;
                    cmd.args.blitFromTexture.isDepthStencil = true;
                }
            }
        }

        const bool mayDiscardDepthStencil =
            (rtTex->m_desc.depthStencilBuffer()
             || (rtTex->m_desc.depthTexture() && rtTex->m_flags.testFlag(QRhiTextureRenderTarget::DoNotStoreDepthStencilContents)))
            && !rtTex->m_desc.depthResolveTexture();
        if (mayDiscardDepthStencil) {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::InvalidateFramebuffer;
            if (caps.needsDepthStencilCombinedAttach) {
                cmd.args.invalidateFramebuffer.attCount = 1;
                cmd.args.invalidateFramebuffer.att[0] = GL_DEPTH_STENCIL_ATTACHMENT;
            } else {
                cmd.args.invalidateFramebuffer.attCount = 2;
                cmd.args.invalidateFramebuffer.att[0] = GL_DEPTH_ATTACHMENT;
                cmd.args.invalidateFramebuffer.att[1] = GL_STENCIL_ATTACHMENT;
            }
        }
    }

    cbD->recordingPass = QGles2CommandBuffer::NoPass;
    cbD->currentTarget = nullptr;

    if (resourceUpdates)
        enqueueResourceUpdates(cb, resourceUpdates);
}